

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O3

void __thiscall serialization::xml_oarchive::serialize_start(xml_oarchive *this)

{
  xml_node<char> *child;
  
  rapidxml::xml_document<char>::clear(&this->document_);
  child = (xml_node<char> *)
          rapidxml::memory_pool<char>::allocate_aligned
                    (&(this->document_).super_memory_pool<char>,0x60);
  (child->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (child->super_xml_base<char>).m_value = (char *)0x0;
  child->m_type = node_element;
  child->m_first_node = (xml_node<char> *)0x0;
  child->m_first_attribute = (xml_attribute<char> *)0x0;
  (child->super_xml_base<char>).m_name = "serialization";
  (child->super_xml_base<char>).m_name_size = 0xd;
  this->current_ = child;
  rapidxml::xml_node<char>::append_node((xml_node<char> *)this,child);
  (this->str_)._M_string_length = 0;
  *(this->str_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void serialize_start()
    {
        serialization_trace trace(__func__, "xml");
        document_.clear();
        current_ = document_.allocate_node(rapidxml::node_element, "serialization");
        document_.append_node(current_);
        str_.clear();
    }